

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O2

String * __thiscall kj::CidrRange::toString(String *__return_storage_ptr__,CidrRange *this)

{
  ulong uVar1;
  uint *in_R8;
  Fault f;
  DebugComparison<const_char_*,_char_(&)[128]> _kjCondition;
  char result [128];
  Fault local_c8;
  DebugComparison<const_char_*,_char_(&)[128]> local_c0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_c0.left = inet_ntop(this->family,this->bits,(char *)&local_98,0x80);
  local_c0.op.content.ptr = " == ";
  local_c0.op.content.size_ = 5;
  local_c0.result = (char (*) [128])local_c0.left == (char (*) [128])&local_98;
  local_c0.right = (char (*) [128])&local_98;
  if (local_c0.result) {
    uVar1 = (ulong)local_c0.left >> 8;
    local_c0.left = (char *)CONCAT71((int7)uVar1,0x2f);
    str<char(&)[128],char,unsigned_int_const&>
              (__return_storage_ptr__,(kj *)&local_98,(char (*) [128])&local_c0,
               (char *)&this->bitCount,in_R8);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char_const*,char(&)[128]>&>
            (&local_c8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
             ,0xa4,FAILED,"inet_ntop(family, (void*)bits, result, sizeof(result)) == result",
             "_kjCondition,",&local_c0);
  kj::_::Debug::Fault::fatal(&local_c8);
}

Assistant:

String CidrRange::toString() const {
  char result[128]{};
  KJ_ASSERT(inet_ntop(family, (void*)bits, result, sizeof(result)) == result);
  return kj::str(result, '/', bitCount);
}